

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapEdit.cc
# Opt level: O3

void mapLoad(string *path,
            vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *obstacles)

{
  iterator __position;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *this;
  char cVar1;
  long lVar2;
  istream *piVar3;
  long *plVar4;
  long *plVar5;
  pointer pvVar6;
  ulong uVar7;
  __m128d t;
  size_t size;
  string s;
  Point2d pt;
  string error;
  ifstream file;
  ulong local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  Point_<int> local_3e0;
  double local_3d8;
  double dStack_3d0;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_3c8;
  long *local_3c0;
  long local_3b8;
  long local_3b0;
  long lStack_3a8;
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)path,_S_in);
  lVar2 = *(long *)(local_238[0] + -0x18);
  if ((abStack_218[lVar2] & 5) == 0) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    local_400._M_string_length = 0;
    local_400.field_2._M_local_buf[0] = '\0';
    local_3c8 = obstacles;
    while( true ) {
      this = local_3c8;
      cVar1 = std::ios::widen((char)&local_408 + (char)lVar2 + -0x30);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_400,cVar1);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream((stringstream *)&local_3c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,local_400._M_dataplus._M_p,local_400._M_string_length);
      __position._M_current =
           (this->
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->
          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ::_M_realloc_insert<>(this,__position);
        pvVar6 = (this->
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        ((__position._M_current)->
        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position._M_current)->
        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__position._M_current)->
        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar6 = (this->
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1;
        (this->
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pvVar6;
      }
      local_408 = 0;
      std::istream::_M_extract<unsigned_long>((ulong *)&local_3c0);
      if (local_408 != 0) {
        uVar7 = 0;
        do {
          local_3d8 = 0.0;
          dStack_3d0 = 0.0;
          piVar3 = std::istream::_M_extract<double>((double *)&local_3c0);
          std::istream::_M_extract<double>((double *)piVar3);
          local_3e0.x = (int)ROUND(local_3d8);
          local_3e0.y = (int)ROUND(dStack_3d0);
          std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
          emplace_back<cv::Point_<int>>
                    ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)(pvVar6 + -1),
                     &local_3e0);
          uVar7 = uVar7 + 1;
        } while (uVar7 < local_408);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_3c0);
      std::ios_base::~ios_base(local_340);
      lVar2 = *(long *)(local_238[0] + -0x18);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,
                      CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                               local_400.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  std::operator+(&local_400,"map of \'",path);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_400);
  local_3c0 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_3c0 == plVar5) {
    local_3b0 = *plVar5;
    lStack_3a8 = plVar4[3];
    local_3c0 = &local_3b0;
  }
  else {
    local_3b0 = *plVar5;
  }
  local_3b8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,
                    CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                             local_400.field_2._M_local_buf[0]) + 1);
  }
  plVar4 = (long *)__cxa_allocate_exception(8);
  *plVar4 = (long)local_3c0;
  __cxa_throw(plVar4,&char_const*::typeinfo,0);
}

Assistant:

void mapLoad(std::string path, std::vector<std::vector<cv::Point>>& obstacles) {
    std::ifstream file(path, std::ios::in);
    if (!file) {
        std::string error = "map of '" + path + "' does not exist.";
        throw error.c_str();
    }
    std::string s;
    while (getline(file, s)) {
        std::stringstream ss;
        ss << s;
        obstacles.emplace_back();
        Obstacle& obs = obstacles.back();
        size_t size = 0;
        ss >> size;
        for (size_t i = 0; i < size; i++) {
            cv::Point2d pt;
            ss >> pt.x >> pt.y;
            obs.push_back(pt);
        }
    }
}